

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TextureSizeCase::TextureSizeCase
          (TextureSizeCase *this,Context *context,char *name,char *desc,char *samplerType,
          TextureSpec *texture,bool isVertexCase)

{
  bool local_3a;
  bool isVertexCase_local;
  TextureSpec *texture_local;
  char *samplerType_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  TextureSizeCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureSizeCase_0329ae98;
  this->m_samplerTypeStr = samplerType;
  memcpy(&this->m_textureSpec,texture,0x54);
  this->m_isVertexCase = isVertexCase;
  local_3a = true;
  if (texture->type != TEXTURETYPE_3D) {
    local_3a = texture->type == TEXTURETYPE_2D_ARRAY;
  }
  this->m_has3DSize = local_3a;
  this->m_program = (ShaderProgram *)0x0;
  this->m_iterationCounter = 0;
  return;
}

Assistant:

TextureSizeCase::TextureSizeCase (Context& context, const char* name, const char* desc, const char* samplerType, const TextureSpec& texture, bool isVertexCase)
	: TestCase			(context, name, desc)
	, m_samplerTypeStr	(samplerType)
	, m_textureSpec		(texture)
	, m_isVertexCase	(isVertexCase)
	, m_has3DSize		(texture.type == TEXTURETYPE_3D || texture.type == TEXTURETYPE_2D_ARRAY)
	, m_program			(DE_NULL)
	, m_iterationCounter(0)
{
}